

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_upstream.c
# Opt level: O2

char * ngx_stream_upstream_server(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  u_char *__s1;
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t *psVar4;
  ngx_array_t *pnVar5;
  size_t sVar6;
  ngx_int_t nVar7;
  char *fmt;
  ngx_url_t *pnVar8;
  ulong uVar9;
  ngx_url_t local_158;
  undefined1 local_80 [8];
  ngx_str_t s;
  size_t local_68;
  size_t local_60;
  size_t local_50;
  size_t local_48;
  
  psVar4 = (size_t *)ngx_array_push(*(ngx_array_t **)((long)conf + 0x20));
  if (psVar4 != (size_t *)0x0) {
    psVar4[8] = 0;
    psVar4[9] = 0;
    psVar4[6] = 0;
    psVar4[7] = 0;
    psVar4[4] = 0;
    psVar4[5] = 0;
    psVar4[2] = 0;
    psVar4[3] = 0;
    *psVar4 = 0;
    psVar4[1] = 0;
    pnVar5 = cf->args;
    s.data = (u_char *)pnVar5->elts;
    pnVar8 = (ngx_url_t *)(s.data + 0x20);
    local_60 = 0;
    local_48 = 10;
    local_68 = 1;
    local_50 = 1;
    for (uVar9 = 2; uVar9 < pnVar5->nelts; uVar9 = uVar9 + 1) {
      __s1 = (pnVar8->url).data;
      iVar3 = strncmp((char *)__s1,"weight=",7);
      if (iVar3 != 0) {
        iVar3 = strncmp((char *)__s1,"max_conns=",10);
        if (iVar3 == 0) {
          if ((*(byte *)((long)conf + 0x29) & 1) != 0) {
            sVar6 = ngx_atoi(__s1 + 10,(pnVar8->url).len - 10);
            local_60 = sVar6;
LAB_0018a938:
            if (sVar6 == 0xffffffffffffffff) goto LAB_0018a9d7;
            goto LAB_0018a956;
          }
        }
        else {
          iVar3 = strncmp((char *)__s1,"max_fails=",10);
          if (iVar3 == 0) {
            if ((*(byte *)((long)conf + 0x28) & 4) != 0) {
              sVar6 = ngx_atoi(__s1 + 10,(pnVar8->url).len - 10);
              local_50 = sVar6;
              goto LAB_0018a938;
            }
          }
          else {
            iVar3 = strncmp((char *)__s1,"fail_timeout=",0xd);
            if (iVar3 == 0) {
              if ((*(byte *)((long)conf + 0x28) & 8) != 0) {
                local_80 = (undefined1  [8])((pnVar8->url).len - 0xd);
                s.len = (size_t)(__s1 + 0xd);
                sVar6 = ngx_parse_time((ngx_str_t *)local_80,1);
                local_48 = sVar6;
                goto LAB_0018a938;
              }
            }
            else {
              iVar3 = strcmp((char *)__s1,"backup");
              if (iVar3 == 0) {
                bVar2 = 2;
                bVar1 = *(byte *)((long)conf + 0x28) & 0x20;
              }
              else {
                iVar3 = strcmp((char *)__s1,"down");
                if (iVar3 != 0) goto LAB_0018a9d7;
                bVar2 = 1;
                bVar1 = *(byte *)((long)conf + 0x28) & 0x10;
              }
              if (bVar1 != 0) {
                *(byte *)(psVar4 + 9) = (byte)psVar4[9] | bVar2;
                goto LAB_0018a956;
              }
            }
          }
        }
LAB_0018a9ce:
        fmt = "balancing method does not support parameter \"%V\"";
        goto LAB_0018a9ea;
      }
      if ((*(byte *)((long)conf + 0x28) & 2) == 0) goto LAB_0018a9ce;
      local_68 = ngx_atoi(__s1 + 7,(pnVar8->url).len - 7);
      if (local_68 + 1 < 2) {
LAB_0018a9d7:
        fmt = "invalid parameter \"%V\"";
        goto LAB_0018a9ea;
      }
LAB_0018a956:
      pnVar5 = cf->args;
      pnVar8 = (ngx_url_t *)&pnVar8->host;
    }
    memset(&local_158.host,0,200);
    local_158.url.len = *(size_t *)(s.data + 0x10);
    local_158.url.data = *(u_char **)(s.data + 0x18);
    nVar7 = ngx_parse_url(cf->pool,&local_158);
    if (nVar7 == 0) {
      if ((local_158._72_1_ & 8) == 0) {
        *psVar4 = local_158.url.len;
        psVar4[1] = (size_t)local_158.url.data;
        psVar4[2] = (size_t)local_158.addrs;
        psVar4[3] = local_158.naddrs;
        psVar4[4] = local_68;
        psVar4[5] = local_60;
        psVar4[6] = local_50;
        psVar4[7] = local_48;
        return (char *)0x0;
      }
      fmt = "no port in upstream \"%V\"";
      pnVar8 = &local_158;
LAB_0018a9ea:
      ngx_conf_log_error(1,cf,0,fmt,pnVar8);
    }
    else if (local_158.err != (char *)0x0) {
      ngx_conf_log_error(1,cf,0,"%s in upstream \"%V\"",local_158.err,&local_158);
    }
  }
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_stream_upstream_server(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_stream_upstream_srv_conf_t  *uscf = conf;

    time_t                         fail_timeout;
    ngx_str_t                     *value, s;
    ngx_url_t                      u;
    ngx_int_t                      weight, max_conns, max_fails;
    ngx_uint_t                     i;
    ngx_stream_upstream_server_t  *us;

    us = ngx_array_push(uscf->servers);
    if (us == NULL) {
        return NGX_CONF_ERROR;
    }

    ngx_memzero(us, sizeof(ngx_stream_upstream_server_t));

    value = cf->args->elts;

    weight = 1;
    max_conns = 0;
    max_fails = 1;
    fail_timeout = 10;

    for (i = 2; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "weight=", 7) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_WEIGHT)) {
                goto not_supported;
            }

            weight = ngx_atoi(&value[i].data[7], value[i].len - 7);

            if (weight == NGX_ERROR || weight == 0) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "max_conns=", 10) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_MAX_CONNS)) {
                goto not_supported;
            }

            max_conns = ngx_atoi(&value[i].data[10], value[i].len - 10);

            if (max_conns == NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "max_fails=", 10) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_MAX_FAILS)) {
                goto not_supported;
            }

            max_fails = ngx_atoi(&value[i].data[10], value[i].len - 10);

            if (max_fails == NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "fail_timeout=", 13) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_FAIL_TIMEOUT)) {
                goto not_supported;
            }

            s.len = value[i].len - 13;
            s.data = &value[i].data[13];

            fail_timeout = ngx_parse_time(&s, 1);

            if (fail_timeout == (time_t) NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "backup") == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_BACKUP)) {
                goto not_supported;
            }

            us->backup = 1;

            continue;
        }

        if (ngx_strcmp(value[i].data, "down") == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_DOWN)) {
                goto not_supported;
            }

            us->down = 1;

            continue;
        }

        goto invalid;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url = value[1];

    if (ngx_parse_url(cf->pool, &u) != NGX_OK) {
        if (u.err) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "%s in upstream \"%V\"", u.err, &u.url);
        }

        return NGX_CONF_ERROR;
    }

    if (u.no_port) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "no port in upstream \"%V\"", &u.url);
        return NGX_CONF_ERROR;
    }

    us->name = u.url;
    us->addrs = u.addrs;
    us->naddrs = u.naddrs;
    us->weight = weight;
    us->max_conns = max_conns;
    us->max_fails = max_fails;
    us->fail_timeout = fail_timeout;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid parameter \"%V\"", &value[i]);

    return NGX_CONF_ERROR;

not_supported:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "balancing method does not support parameter \"%V\"",
                       &value[i]);

    return NGX_CONF_ERROR;
}